

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.h
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
gmath::operator>>(basic_istream<char,_std::char_traits<char>_> *in,SVector<double,_6> *a)

{
  basic_istream<char,_std::char_traits<char>_> *this;
  double *pdVar1;
  SVector<double,_6> *in_RSI;
  istream *in_RDI;
  int i;
  char c;
  bool local_19;
  int local_18;
  char local_11;
  SVector<double,_6> *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator>>(in_RDI,&local_11);
  if (local_11 == '[') {
    local_18 = 0;
    while( true ) {
      local_19 = false;
      if (local_18 < 6) {
        local_19 = std::ios::operator_cast_to_bool
                             ((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
      }
      this = local_8;
      if (local_19 == false) break;
      pdVar1 = SVector<double,_6>::operator[](local_10,local_18);
      std::istream::operator>>(this,pdVar1);
      local_18 = local_18 + 1;
    }
    std::operator>>(local_8,&local_11);
    if (local_11 != ']') {
      std::ios::setstate((int)local_8 + (int)*(undefined8 *)(*(long *)local_8 + -0x18));
    }
  }
  else {
    std::ios::setstate((int)local_8 + (int)*(undefined8 *)(*(long *)local_8 + -0x18));
  }
  return local_8;
}

Assistant:

std::basic_istream<Ch, Tr> &operator>>(std::basic_istream<Ch, Tr> &in, SVector<T, n> &a)
{
  char c;

  in >> c;

  if (c == '[')
  {
    for (int i=0; i<n && in; i++)
    {
      in >> a[i];
    }

    in >> c;

    if (c != ']')
    {
      in.setstate(std::ios_base::failbit);
    }
  }
  else
  {
    in.setstate(std::ios_base::failbit);
  }

  return in;
}